

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Loop.H
# Opt level: O0

void amrex::
     LoopConcurrentOnCpu<amrex::MLNodeLaplacian::restriction(int,int,amrex::MultiFab&,amrex::MultiFab&)const::__2>
               (Box *bx,anon_class_32_4_0c5d7522 *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *in_RDI;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  int in_stack_00000e54;
  int in_stack_00000e58;
  int in_stack_00000e5c;
  anon_class_32_4_0c5d7522 *in_stack_00000e60;
  int local_104;
  int local_100;
  int local_fc;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[3];
  iVar4 = in_RDI[4];
  iVar5 = in_RDI[5];
  for (local_fc = in_RDI[2]; local_100 = iVar2, local_fc <= iVar5; local_fc = local_fc + 1) {
    for (; local_104 = iVar1, local_100 <= iVar4; local_100 = local_100 + 1) {
      for (; local_104 <= iVar3; local_104 = local_104 + 1) {
        MLNodeLaplacian::restriction::anon_class_32_4_0c5d7522::operator()
                  (in_stack_00000e60,in_stack_00000e5c,in_stack_00000e58,in_stack_00000e54);
      }
    }
  }
  return;
}

Assistant:

void LoopConcurrentOnCpu (Box const& bx, F&& f) noexcept
{
    const auto lo = amrex::lbound(bx);
    const auto hi = amrex::ubound(bx);
    for (int k = lo.z; k <= hi.z; ++k) {
    for (int j = lo.y; j <= hi.y; ++j) {
    AMREX_PRAGMA_SIMD
    for (int i = lo.x; i <= hi.x; ++i) {
        f(i,j,k);
    }}}
}